

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

void stripctrl_term_BinarySink_write(BinarySink *bs,void *vp,size_t len)

{
  _Bool _Var1;
  unsigned_long local_48;
  unsigned_long t;
  uchar *p;
  _Bool utf;
  StripCtrlCharsImpl *scc;
  StripCtrlChars *sccpub;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  _Var1 = in_utf((Terminal *)bs[-3].binarysink_);
  t = (unsigned_long)vp;
  sccpub = (StripCtrlChars *)len;
  if (_Var1 != (_Bool)(*(byte *)&bs[-2].write & 1)) {
    *(_Bool *)&bs[-2].write = _Var1;
    *(undefined4 *)((long)&bs[-2].write + 4) = 0;
  }
  for (; sccpub != (StripCtrlChars *)0x0;
      sccpub = (StripCtrlChars *)((long)&sccpub[-1].binarysink_[0].binarysink_ + 7)) {
    local_48 = (*(code *)bs[-2].binarysink_)
                         (bs[-3].binarysink_,(undefined1 *)((long)&bs[-2].write + 4),
                          *(undefined1 *)t);
    if (local_48 == 0x80000021) {
      stripctrl_term_put_wc((StripCtrlCharsImpl *)&bs[-7].binarysink_,0xfffd);
      local_48 = (*(code *)bs[-2].binarysink_)
                           (bs[-3].binarysink_,(undefined1 *)((long)&bs[-2].write + 4),
                            *(undefined1 *)t);
    }
    if (local_48 != 0x8000003f) {
      if (local_48 == 0x8000002a) {
        local_48 = 0xfffd;
      }
      stripctrl_term_put_wc((StripCtrlCharsImpl *)&bs[-7].binarysink_,local_48);
    }
    t = t + 1;
  }
  return;
}

Assistant:

static void stripctrl_term_BinarySink_write(
    BinarySink *bs, const void *vp, size_t len)
{
    StripCtrlChars *sccpub = BinarySink_DOWNCAST(bs, StripCtrlChars);
    StripCtrlCharsImpl *scc =
        container_of(sccpub, StripCtrlCharsImpl, public);

    bool utf = in_utf(scc->term);
    if (utf != scc->last_term_utf) {
        scc->last_term_utf = utf;
        scc->utf8.state = 0;
    }

    for (const unsigned char *p = (const unsigned char *)vp;
         len > 0; len--, p++) {
        unsigned long t = scc->translate(scc->term, &scc->utf8, *p);
        if (t == UCSTRUNCATED) {
            stripctrl_term_put_wc(scc, 0xFFFD);
            /* go round again */
            t = scc->translate(scc->term, &scc->utf8, *p);
        }
        if (t == UCSINCOMPLETE)
            continue;
        if (t == UCSINVALID)
            t = 0xFFFD;

        stripctrl_term_put_wc(scc, t);
    }
}